

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QRegion __thiscall QTableView::visualRegionForSelection(QTableView *this,QItemSelection *selection)

{
  QAbstractItemModel *pQVar1;
  Span *this_00;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QTableViewPrivate *pQVar8;
  ulong uVar9;
  Span **ppSVar10;
  long *in_RSI;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QRect *visualSpanRect;
  Span *s;
  QSet<QSpanCollection::Span_*> *__range6;
  int rright;
  int rleft;
  int rbottom;
  int rtop;
  QItemSelection *__range4_1;
  int gridAdjust;
  int r_1;
  int width;
  QItemSelectionRange *range_2;
  QItemSelection *__range4;
  int c_1;
  int height;
  QItemSelectionRange *range_1;
  QItemSelection *__range3;
  QRect *rangeRect;
  int c;
  int r;
  QItemSelectionRange *range;
  QItemSelection *__range2;
  bool horizontalMoved;
  bool verticalMoved;
  QRect *viewportRect;
  QTableViewPrivate *d;
  QRegion *selectionRegion;
  const_iterator __end6;
  const_iterator __begin6;
  QSet<QSpanCollection::Span_*> spansInRect;
  QRect rangeRect_3;
  QItemSelectionRange range_3;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  QRect rangeRect_2;
  int right;
  int left;
  const_iterator __end4;
  const_iterator __begin4;
  QRect rangeRect_1;
  int bottom;
  int top;
  const_iterator __end3;
  const_iterator __begin3;
  const_iterator __end2;
  const_iterator __begin2;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  QRect *in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd00;
  uint in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  byte local_2c9;
  byte local_2a9;
  int local_250;
  int local_238;
  int local_218;
  int local_214;
  QRect local_1c8 [2];
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_140;
  undefined1 *local_138;
  QItemSelectionRange *local_130;
  const_iterator local_128;
  const_iterator local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  int local_108;
  int local_104;
  QItemSelectionRange *local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  int local_c0;
  int local_bc;
  QItemSelectionRange *local_a0;
  const_iterator local_98;
  const_iterator local_90;
  QPersistentModelIndex local_88 [3];
  undefined1 local_70 [24];
  undefined1 local_58 [2] [16];
  QItemSelectionRange *local_30;
  const_iterator local_28;
  const_iterator local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QTableView *)0x8bb7dc);
  bVar3 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x8bb7f1);
  if (bVar3) {
    QRegion::QRegion((QRegion *)in_RDI);
  }
  else {
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)in_RDI);
    local_18 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    verticalHeader((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    bVar3 = QHeaderView::sectionsMoved
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    horizontalHeader((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    bVar4 = QHeaderView::sectionsMoved
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    if (((bVar3) && (bVar4)) ||
       ((bVar5 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bb8cb), bVar5 &&
        ((bVar3 || (bVar4)))))) {
      local_20.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_20 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_28.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      while( true ) {
        local_30 = local_28.i;
        bVar3 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_20,local_28);
        if (!bVar3) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_20);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        bVar3 = ::operator!=((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QPersistentModelIndex *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_2a9 = 1;
        if (!bVar3) {
          bVar3 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          local_2a9 = bVar3 ^ 0xff;
        }
        if ((local_2a9 & 1) == 0) {
          local_214 = QItemSelectionRange::top((QItemSelectionRange *)0x8bba18);
          while( true ) {
            iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8bba37);
            if (iVar6 < local_214) break;
            local_218 = QItemSelectionRange::left((QItemSelectionRange *)0x8bba52);
            while( true ) {
              iVar6 = QItemSelectionRange::right((QItemSelectionRange *)0x8bba71);
              if (iVar6 < local_218) break;
              pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
              QPersistentModelIndex::operator_cast_to_QModelIndex(local_88);
              (**(code **)(*(long *)pQVar1 + 0x60))(local_70,pQVar1,local_214,local_218,local_88);
              auVar11 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,local_70);
              local_58[0] = auVar11;
              uVar9 = QRect::intersects((QRect *)&local_18);
              if ((uVar9 & 1) != 0) {
                QRegion::operator+=((QRegion *)in_RDI,(QRect *)local_58);
              }
              local_218 = local_218 + 1;
            }
            local_214 = local_214 + 1;
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_20);
      }
    }
    else if (bVar4) {
      local_90.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_90 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_98.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      while( true ) {
        local_a0 = local_98.i;
        bVar3 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_90,local_98);
        if (!bVar3) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_90);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        bVar3 = ::operator!=((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QPersistentModelIndex *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        local_2c9 = 1;
        if (!bVar3) {
          bVar3 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          local_2c9 = bVar3 ^ 0xff;
        }
        if ((local_2c9 & 1) == 0) {
          QItemSelectionRange::top((QItemSelectionRange *)0x8bbce6);
          local_bc = rowViewportPosition((QTableView *)
                                         CONCAT44(in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0),
                                         in_stack_fffffffffffffcdc);
          QItemSelectionRange::bottom((QItemSelectionRange *)0x8bbd09);
          iVar6 = rowViewportPosition((QTableView *)
                                      CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                      in_stack_fffffffffffffcdc);
          QItemSelectionRange::bottom((QItemSelectionRange *)0x8bbd29);
          local_c0 = rowHeight((QTableView *)
                               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                               in_stack_fffffffffffffcdc);
          local_c0 = iVar6 + local_c0;
          if (local_c0 < local_bc) {
            qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          }
          local_238 = QItemSelectionRange::left((QItemSelectionRange *)0x8bbd8e);
          while (iVar6 = local_238,
                iVar7 = QItemSelectionRange::right((QItemSelectionRange *)0x8bbdad), iVar6 <= iVar7)
          {
            local_d0 = &DAT_aaaaaaaaaaaaaaaa;
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            columnViewportPosition
                      ((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcdc);
            columnWidth((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        in_stack_fffffffffffffcdc);
            QRect::QRect(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                         in_stack_fffffffffffffcd8);
            uVar9 = QRect::intersects((QRect *)&local_18);
            if ((uVar9 & 1) != 0) {
              QRegion::operator+=((QRegion *)in_RDI,(QRect *)&local_d0);
            }
            local_238 = local_238 + 1;
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_90);
      }
    }
    else if (bVar3) {
      local_d8.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_e0.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_e0 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      while( true ) {
        local_e8 = local_e0.i;
        bVar3 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_d8,local_e0);
        if (!bVar3) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_d8);
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        bVar3 = ::operator!=((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QPersistentModelIndex *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        bVar2 = 1;
        if (!bVar3) {
          bVar3 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          bVar2 = bVar3 ^ 0xff;
        }
        if ((bVar2 & 1) == 0) {
          QItemSelectionRange::left((QItemSelectionRange *)0x8bbfca);
          local_104 = columnViewportPosition
                                ((QTableView *)
                                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                 in_stack_fffffffffffffcdc);
          QItemSelectionRange::right((QItemSelectionRange *)0x8bbfed);
          iVar6 = columnViewportPosition
                            ((QTableView *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             in_stack_fffffffffffffcdc);
          QItemSelectionRange::right((QItemSelectionRange *)0x8bc00d);
          local_108 = columnWidth((QTableView *)
                                  CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                  in_stack_fffffffffffffcdc);
          local_108 = iVar6 + local_108;
          if (local_108 < local_104) {
            qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       (int *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          }
          local_250 = QItemSelectionRange::top((QItemSelectionRange *)0x8bc072);
          while (iVar6 = local_250,
                iVar7 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8bc091), iVar6 <= iVar7
                ) {
            local_118 = &DAT_aaaaaaaaaaaaaaaa;
            local_110 = &DAT_aaaaaaaaaaaaaaaa;
            rowViewportPosition((QTableView *)
                                CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                in_stack_fffffffffffffcdc);
            rowHeight((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      in_stack_fffffffffffffcdc);
            QRect::QRect(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4,
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                         in_stack_fffffffffffffcd8);
            uVar9 = QRect::intersects((QRect *)&local_18);
            if ((uVar9 & 1) != 0) {
              QRegion::operator+=((QRegion *)in_RDI,(QRect *)&local_118);
            }
            local_250 = local_250 + 1;
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_d8);
      }
    }
    else {
      showGrid((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_120.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_120 = QList<QItemSelectionRange>::begin
                            ((QList<QItemSelectionRange> *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_128.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_128 = QList<QItemSelectionRange>::end
                            ((QList<QItemSelectionRange> *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      while( true ) {
        local_130 = local_128.i;
        bVar3 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_120,local_128);
        if (!bVar3) break;
        local_140 = &DAT_aaaaaaaaaaaaaaaa;
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_120);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        bVar3 = ::operator!=((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             (QPersistentModelIndex *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        in_stack_fffffffffffffd08 = CONCAT13(1,(int3)in_stack_fffffffffffffd08);
        if (!bVar3) {
          bVar3 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          in_stack_fffffffffffffd08 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd08) ^ 0xff000000;
        }
        if ((in_stack_fffffffffffffd08 & 0x1000000) == 0) {
          QTableViewPrivate::trimHiddenSelections
                    ((QTableViewPrivate *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     (QItemSelectionRange *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
          QItemSelectionRange::top((QItemSelectionRange *)0x8bc2ff);
          rowViewportPosition((QTableView *)
                              CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                              in_stack_fffffffffffffcdc);
          QItemSelectionRange::bottom((QItemSelectionRange *)0x8bc322);
          iVar6 = rowViewportPosition((QTableView *)
                                      CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                      in_stack_fffffffffffffcdc);
          QItemSelectionRange::bottom((QItemSelectionRange *)0x8bc342);
          rowHeight((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcdc);
          bVar3 = QWidget::isLeftToRight((QWidget *)0x8bc383);
          if (bVar3) {
            QItemSelectionRange::left((QItemSelectionRange *)0x8bc396);
            columnViewportPosition
                      ((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcdc);
            QItemSelectionRange::right((QItemSelectionRange *)0x8bc3b9);
            in_stack_fffffffffffffd00 =
                 columnViewportPosition
                           ((QTableView *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            in_stack_fffffffffffffcdc);
            QItemSelectionRange::right((QItemSelectionRange *)0x8bc3d9);
            columnWidth((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        in_stack_fffffffffffffcdc);
          }
          else {
            QItemSelectionRange::right((QItemSelectionRange *)0x8bc406);
            columnViewportPosition
                      ((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcdc);
            QItemSelectionRange::left((QItemSelectionRange *)0x8bc429);
            in_stack_fffffffffffffcfc =
                 columnViewportPosition
                           ((QTableView *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            in_stack_fffffffffffffcdc);
            QItemSelectionRange::left((QItemSelectionRange *)0x8bc449);
            columnWidth((QTableView *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        in_stack_fffffffffffffcdc);
          }
          local_168 = &DAT_aaaaaaaaaaaaaaaa;
          local_160 = &DAT_aaaaaaaaaaaaaaaa;
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
          QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                         in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
          QRect::QRect((QRect *)CONCAT44(iVar6,in_stack_fffffffffffffd00),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          uVar9 = QRect::intersects((QRect *)&local_18);
          if ((uVar9 & 1) != 0) {
            QRegion::operator+=((QRegion *)in_RDI,(QRect *)&local_168);
          }
          bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8bc529);
          if (bVar3) {
            local_180 = &DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffcf0 = QItemSelectionRange::left((QItemSelectionRange *)0x8bc561);
            in_stack_fffffffffffffcf4 = QItemSelectionRange::top((QItemSelectionRange *)0x8bc572);
            in_stack_fffffffffffffcf8 =
                 QItemSelectionRange::width
                           ((QItemSelectionRange *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
            QItemSelectionRange::height
                      ((QItemSelectionRange *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
            QSpanCollection::spansInRect
                      ((QSpanCollection *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),iVar6,
                       in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                      );
            local_190 = &DAT_aaaaaaaaaaaaaaaa;
            local_188 = &DAT_aaaaaaaaaaaaaaaa;
            QSet<QSpanCollection::Span_*>::begin
                      ((QSet<QSpanCollection::Span_*> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
            local_198 = &DAT_aaaaaaaaaaaaaaaa;
            QSet<QSpanCollection::Span_*>::end
                      ((QSet<QSpanCollection::Span_*> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            while (bVar3 = QSet<QSpanCollection::Span_*>::const_iterator::operator!=
                                     ((const_iterator *)
                                      CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                      (const_iterator *)
                                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
                  , bVar3) {
              ppSVar10 = QSet<QSpanCollection::Span_*>::const_iterator::operator*
                                   ((const_iterator *)0x8bc669);
              this_00 = *ppSVar10;
              in_stack_fffffffffffffce0 = QSpanCollection::Span::top(this_00);
              in_stack_fffffffffffffce4 = QSpanCollection::Span::left(this_00);
              QItemSelectionRange::parent
                        ((QItemSelectionRange *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
              bVar3 = QItemSelectionRange::contains
                                ((QItemSelectionRange *)CONCAT44(iVar6,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                                 (QModelIndex *)
                                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
              if (bVar3) {
                local_1c8[0] = QTableViewPrivate::visualSpanRect
                                         ((QTableViewPrivate *)
                                          CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),
                                          (Span *)CONCAT44(in_stack_fffffffffffffd24,
                                                           in_stack_fffffffffffffd20));
                uVar9 = QRect::intersects((QRect *)&local_18);
                if ((uVar9 & 1) != 0) {
                  QRegion::operator+=((QRegion *)in_RDI,(QRect *)local_1c8);
                }
              }
              QSet<QSpanCollection::Span_*>::const_iterator::operator++
                        ((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
            }
            QSet<QSpanCollection::Span_*>::~QSet((QSet<QSpanCollection::Span_*> *)0x8bc768);
          }
        }
        QItemSelectionRange::~QItemSelectionRange
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        QList<QItemSelectionRange>::const_iterator::operator++(&local_120);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QTableView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTableView);

    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    bool verticalMoved = verticalHeader()->sectionsMoved();
    bool horizontalMoved = horizontalHeader()->sectionsMoved();

    if ((verticalMoved && horizontalMoved) || (d->hasSpans() && (verticalMoved || horizontalMoved))) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            for (int r = range.top(); r <= range.bottom(); ++r)
                for (int c = range.left(); c <= range.right(); ++c) {
                    const QRect &rangeRect = visualRect(d->model->index(r, c, d->root));
                    if (viewportRect.intersects(rangeRect))
                        selectionRegion += rangeRect;
                }
        }
    } else if (horizontalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int top = rowViewportPosition(range.top());
            int bottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            if (top > bottom)
                qSwap<int>(top, bottom);
            int height = bottom - top;
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else if (verticalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int left = columnViewportPosition(range.left());
            int right = columnViewportPosition(range.right()) + columnWidth(range.right());
            if (left > right)
                qSwap<int>(left, right);
            int width = right - left;
            for (int r = range.top(); r <= range.bottom(); ++r) {
                const QRect rangeRect(left, rowViewportPosition(r), width, rowHeight(r));
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else { // nothing moved
        const int gridAdjust = showGrid() ? 1 : 0;
        for (auto range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            d->trimHiddenSelections(&range);

            const int rtop = rowViewportPosition(range.top());
            const int rbottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            int rleft;
            int rright;
            if (isLeftToRight()) {
                rleft = columnViewportPosition(range.left());
                rright = columnViewportPosition(range.right()) + columnWidth(range.right());
            } else {
                rleft = columnViewportPosition(range.right());
                rright = columnViewportPosition(range.left()) + columnWidth(range.left());
            }
            const QRect rangeRect(QPoint(rleft, rtop), QPoint(rright - 1 - gridAdjust, rbottom - 1 - gridAdjust));
            if (viewportRect.intersects(rangeRect))
                selectionRegion += rangeRect;
            if (d->hasSpans()) {
                const auto spansInRect = d->spans.spansInRect(range.left(), range.top(), range.width(), range.height());
                for (QSpanCollection::Span *s : spansInRect) {
                    if (range.contains(s->top(), s->left(), range.parent())) {
                        const QRect &visualSpanRect = d->visualSpanRect(*s);
                        if (viewportRect.intersects(visualSpanRect))
                            selectionRegion += visualSpanRect;
                    }
                }
            }
        }
    }

    return selectionRegion;
}